

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

bool __thiscall
deqp::RobustBufferAccessBehavior::ImageLoadStoreTest::verifyInvalidResults
          (ImageLoadStoreTest *this,GLuint texture_id)

{
  pointer pfVar1;
  int *piVar2;
  ostringstream *poVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  float *pfVar6;
  GLuint i;
  int iVar7;
  GLenum GVar8;
  deUint32 err;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  ulong uVar10;
  char cVar11;
  float *pfVar12;
  char cVar13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  uint uVar17;
  float fVar22;
  int iVar23;
  uint uVar24;
  float fVar25;
  int iVar26;
  uint uVar27;
  float fVar28;
  int iVar29;
  uint uVar30;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  Texture destination_texture;
  string local_318;
  Program local_2f8;
  Texture local_288;
  string local_278;
  string local_258;
  string local_238;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  Functions *gl;
  
  local_318._M_string_length = (size_type)local_318._M_dataplus._M_p;
  iVar7 = (*((this->super_TexelFetchTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar7);
  (*gl->memoryBarrier)(0x20);
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0xacd);
  auVar5 = (undefined1  [12])local_2f8._4_12_;
  switch((this->super_TexelFetchTest).m_test_case) {
  case R8:
    local_2f8.m_id = 0;
    local_2f8._4_4_ = 0;
    local_2f8.m_compute.m_id = 0;
    local_2f8.m_compute._4_4_ = 0;
    local_2f8.m_compute.m_context = (Context *)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f8,0x100);
    lVar9 = 0;
    do {
      *(uchar *)(local_2f8._0_8_ + lVar9) = (uchar)lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x100);
    (*gl->bindTexture)(0xde1,texture_id);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    (*gl->getTexImage)(0xde1,0,0x1903,0x1401,(void *)local_2f8._0_8_);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    uVar10 = 0;
    if (*(char *)local_2f8._0_8_ == '\0') {
      do {
        uVar14 = uVar10;
        if (uVar14 == 0xff) goto LAB_00d8c013;
        uVar10 = uVar14 + 1;
      } while (*(char *)(local_2f8._0_8_ + uVar14 + 1) == '\0');
      bVar15 = 0xfe < uVar14;
    }
    else {
      bVar15 = false;
    }
    local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Invalid value: ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,". Expected value: ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," at offset: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case RG8_SNORM:
    local_2f8.m_id = 0;
    local_2f8._4_4_ = 0;
    local_2f8.m_compute.m_id = 0;
    local_2f8.m_compute._4_4_ = 0;
    local_2f8.m_compute.m_context = (Context *)0x0;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)&local_2f8,0x200);
    lVar9 = 0;
    do {
      *(uchar *)(local_2f8._0_8_ + lVar9 * 2) = (uchar)lVar9;
      *(uchar *)(local_2f8._0_8_ + lVar9 * 2 + 1) = (uchar)lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x100);
    (*gl->bindTexture)(0xde1,texture_id);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    (*gl->getTexImage)(0xde1,0,0x8227,0x1400,(void *)local_2f8._0_8_);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    cVar13 = *(char *)local_2f8._0_8_;
    cVar11 = *(char *)(local_2f8._0_8_ + 1);
    uVar10 = 0;
    if (cVar13 == '\0' && cVar11 == '\0') {
      do {
        uVar14 = uVar10;
        if (uVar14 == 0xff) goto LAB_00d8c013;
        cVar13 = *(char *)(local_2f8._0_8_ + uVar14 * 2 + 2);
        cVar11 = *(char *)(local_2f8._0_8_ + uVar14 * 2 + 3);
        uVar10 = uVar14 + 1;
      } while (cVar13 == '\0' && cVar11 == '\0');
      bVar15 = 0xfe < uVar14;
    }
    else {
      bVar15 = false;
    }
    local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Invalid value: ",0xf);
    std::ostream::operator<<(poVar3,(int)cVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
    std::ostream::operator<<(poVar3,(int)cVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,". Expected value: ",0x12);
    std::ostream::operator<<(poVar3,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
    std::ostream::operator<<(poVar3,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,". At offset: ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case R32UI_MULTISAMPLE:
    local_2f8.m_compute.m_context = (this->super_TexelFetchTest).super_TestCase.m_context;
    local_2f8._0_8_ = local_2f8._4_8_ << 0x20;
    local_2f8.m_compute._4_4_ = auVar5._8_4_;
    local_2f8.m_compute.m_id = 0;
    local_2f8.m_fragment.m_id = 0;
    local_2f8.m_geometry.m_id = 0;
    local_2f8.m_tess_ctrl.m_id = 0;
    local_2f8.m_tess_eval.m_id = 0;
    local_2f8.m_vertex.m_id = 0;
    local_288.m_id = 0xffffffff;
    local_2f8.m_fragment.m_context = local_2f8.m_compute.m_context;
    local_2f8.m_geometry.m_context = local_2f8.m_compute.m_context;
    local_2f8.m_tess_ctrl.m_context = local_2f8.m_compute.m_context;
    local_2f8.m_tess_eval.m_context = local_2f8.m_compute.m_context;
    local_2f8.m_vertex.m_context = local_2f8.m_compute.m_context;
    local_2f8.m_context = local_2f8.m_compute.m_context;
    local_288.m_context = local_2f8.m_compute.m_context;
    RobustBufferAccessBehavior::Texture::Generate(gl,&local_288.m_id);
    (*gl->bindTexture)(0xde1,local_288.m_id);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    (*gl->texStorage2D)(0xde1,1,0x8236,0x10,0x10);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"TexStorage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x361);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "#version 430 core\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (location = 1)        writeonly uniform uimage2D   uni_destination_image;\nlayout (location = 0, r32ui) readonly  uniform uimage2DMS uni_source_image;\n\nvoid main()\n{\n    const ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n\n    const uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n    const uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n    const uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n    const uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n\n    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(0))))\n    {\n        imageStore(uni_destination_image, point, uvec4(1, 1, 1, 1));\n    }\n    else\n    {\n        imageStore(uni_destination_image, point, uvec4(0, 0, 0, 0));\n    }\n}\n\n"
               ,"");
    local_318._M_dataplus._M_p = (pointer)((long)&local_318 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,0x1aee929);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,0x1aee929);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,0x1aee929);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,0x1aee929);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,0x1aee929);
    RobustBufferAccessBehavior::Program::Init
              (&local_2f8,(string *)local_1b0,&local_318,&local_258,&local_278,&local_238,&local_1d0
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (local_318._M_dataplus._M_p != (pointer)((long)&local_318 + 0x10)) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    iVar7 = (*(local_2f8.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar7) + 0x1680))(local_2f8.m_id);
    err = (**(code **)(CONCAT44(extraout_var_00,iVar7) + 0x800))();
    glu::checkError(err,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x1db);
    (*gl->bindImageTexture)(0,texture_id,0,'\0',0,35000,0x8236);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xb98);
    (*gl->bindImageTexture)(1,local_288.m_id,0,'\0',0,0x88b9,0x8236);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xb9b);
    (*gl->uniform1i)(0,0);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xb9e);
    (*gl->uniform1i)(1,1);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xba1);
    (*gl->dispatchCompute)(0x10,0x10,1);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xba4);
    local_318._M_dataplus._M_p = (pointer)0x0;
    local_318._M_string_length = 0;
    local_318.field_2._M_allocated_capacity = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_318,0x100);
    iVar7 = 0;
    iVar23 = 1;
    iVar26 = 2;
    iVar29 = 3;
    lVar9 = 0;
    do {
      piVar2 = (int *)(local_318._M_dataplus._M_p + lVar9 * 4);
      *piVar2 = iVar7;
      piVar2[1] = iVar23;
      piVar2[2] = iVar26;
      piVar2[3] = iVar29;
      lVar9 = lVar9 + 4;
      iVar7 = iVar7 + 4;
      iVar23 = iVar23 + 4;
      iVar26 = iVar26 + 4;
      iVar29 = iVar29 + 4;
    } while (lVar9 != 0x100);
    (*gl->getTexImage)(0xde1,0,0x8d94,0x1405,local_318._M_dataplus._M_p);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    uVar10 = 0;
    if (*(int *)local_318._M_dataplus._M_p == 1) {
      do {
        uVar14 = uVar10;
        if (uVar14 == 0xff) {
          bVar15 = true;
          goto LAB_00d8cb91;
        }
        uVar10 = uVar14 + 1;
      } while (*(int *)(local_318._M_dataplus._M_p + uVar14 * 4 + 4) == 1);
      bVar15 = 0xfe < uVar14;
    }
    else {
      bVar15 = false;
    }
    local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Invalid value: ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,". Expected value: ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," at offset: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    if ((int *)local_318._M_dataplus._M_p != (int *)0x0) {
LAB_00d8cb91:
      operator_delete(local_318._M_dataplus._M_p,
                      local_318.field_2._M_allocated_capacity - (long)local_318._M_dataplus._M_p);
    }
    RobustBufferAccessBehavior::Texture::~Texture(&local_288);
    RobustBufferAccessBehavior::Program::~Program(&local_2f8);
    return bVar15;
  case RGBA32F:
    local_2f8.m_id = 0;
    local_2f8._4_4_ = 0;
    local_2f8.m_compute.m_id = 0;
    local_2f8.m_compute._4_4_ = 0;
    local_2f8.m_compute.m_context = (Context *)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&local_2f8,0x400);
    uVar17 = 0;
    uVar24 = 1;
    uVar27 = 2;
    uVar30 = 3;
    lVar9 = 0;
    do {
      fVar16 = (((float)(uVar17 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar17 & 0xffff | 0x4b000000)) * 0.00390625;
      fVar22 = (((float)(uVar24 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar24 & 0xffff | 0x4b000000)) * 0.00390625;
      fVar25 = (((float)(uVar27 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar27 & 0xffff | 0x4b000000)) * 0.00390625;
      fVar28 = (((float)(uVar30 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar30 & 0xffff | 0x4b000000)) * 0.00390625;
      pfVar12 = (float *)(local_2f8._0_8_ + lVar9 + 0x30);
      *pfVar12 = fVar28;
      pfVar12[1] = fVar28;
      pfVar12[2] = fVar28;
      pfVar12[3] = fVar28;
      pfVar12 = (float *)(local_2f8._0_8_ + lVar9 + 0x20);
      *pfVar12 = fVar25;
      pfVar12[1] = fVar25;
      pfVar12[2] = fVar25;
      pfVar12[3] = fVar25;
      pfVar12 = (float *)(local_2f8._0_8_ + lVar9 + 0x10);
      *pfVar12 = fVar22;
      pfVar12[1] = fVar22;
      pfVar12[2] = fVar22;
      pfVar12[3] = fVar22;
      pfVar12 = (float *)(local_2f8._0_8_ + lVar9);
      *pfVar12 = fVar16;
      pfVar12[1] = fVar16;
      pfVar12[2] = fVar16;
      pfVar12[3] = fVar16;
      uVar17 = uVar17 + 4;
      uVar24 = uVar24 + 4;
      uVar27 = uVar27 + 4;
      uVar30 = uVar30 + 4;
      lVar9 = lVar9 + 0x40;
    } while (lVar9 != 0x1000);
    (*gl->bindTexture)(0xde1,texture_id);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    (*gl->getTexImage)(0xde1,0,0x1908,0x1406,(void *)local_2f8._0_8_);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar8 = (*gl->getError)();
    uVar10 = 0x28b;
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    fVar16 = *(float *)(local_2f8._0_8_ + 4);
    fVar22 = *(float *)(local_2f8._0_8_ + 8);
    fVar25 = *(float *)(local_2f8._0_8_ + 0xc);
    auVar31._4_4_ = -(uint)(fVar16 != 0.0);
    auVar31._0_4_ = -(uint)(*(float *)local_2f8._0_8_ != 0.0);
    auVar31._8_4_ = -(uint)(fVar22 != 0.0);
    auVar31._12_4_ = -(uint)(fVar25 != 0.0);
    iVar7 = movmskps(extraout_EAX,auVar31);
    if (iVar7 == 0) {
      uVar14 = 0xffffffffffffffff;
      pfVar12 = (float *)local_2f8._0_8_;
      do {
        if (uVar14 == 0xfe) goto LAB_00d8c013;
        fVar16 = pfVar12[4];
        fVar22 = pfVar12[5];
        pfVar6 = pfVar12 + 6;
        fVar25 = *pfVar6;
        fVar28 = pfVar12[7];
        auVar32._4_4_ = -(uint)(fVar22 != 0.0);
        auVar32._0_4_ = -(uint)(fVar16 != 0.0);
        auVar32._8_4_ = -(uint)(fVar25 != 0.0);
        auVar32._12_4_ = -(uint)(fVar28 != 0.0);
        uVar17 = movmskps((int)uVar10,auVar32);
        uVar10 = (ulong)uVar17;
        uVar14 = uVar14 + 1;
        pfVar12 = pfVar12 + 4;
      } while (uVar17 == 0);
      bVar15 = 0xfe < uVar14;
      auVar20._4_4_ = fVar22;
      auVar20._0_4_ = fVar22;
      auVar20._8_4_ = fVar22;
      auVar20._12_4_ = fVar22;
      auVar5._4_8_ = auVar20._8_8_;
      auVar5._0_4_ = fVar22;
      auVar21._0_8_ = auVar5._0_8_ << 0x20;
      auVar21._8_4_ = fVar25;
      auVar21._12_4_ = fVar28;
      local_208 = auVar21._8_8_;
      uStack_1f0 = auVar20._8_8_;
      local_1f8 = *(undefined8 *)pfVar6;
      local_1e8 = fVar16;
      fStack_1e4 = fVar22;
      fStack_1e0 = fVar25;
      fStack_1dc = fVar28;
    }
    else {
      auVar18._4_4_ = fVar16;
      auVar18._0_4_ = fVar16;
      auVar18._8_4_ = fVar16;
      auVar18._12_4_ = fVar16;
      auVar4._4_8_ = auVar18._8_8_;
      auVar4._0_4_ = fVar16;
      auVar19._0_8_ = auVar4._0_8_ << 0x20;
      auVar19._8_4_ = fVar22;
      auVar19._12_4_ = fVar25;
      local_208 = auVar19._8_8_;
      uStack_1f0 = auVar18._8_8_;
      local_1f8 = *(undefined8 *)(local_2f8._0_8_ + 8);
      bVar15 = false;
      local_1e8 = *(float *)local_2f8._0_8_;
      fStack_1e4 = fVar16;
      fStack_1e0 = fVar22;
      fStack_1dc = fVar25;
    }
    local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    local_218 = fStack_1dc;
    fStack_214 = fStack_1dc;
    fStack_210 = fStack_1dc;
    fStack_20c = fStack_1dc;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Invalid value: ",0xf);
    std::ostream::_M_insert<double>((double)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
    std::ostream::_M_insert<double>((double)(float)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
    std::ostream::_M_insert<double>((double)(float)local_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
    std::ostream::_M_insert<double>((double)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,". Expected value: ",0x12);
    std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
    std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
    std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
    std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,". At offset: ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case R32UI_MIPMAP:
    local_2f8.m_id = 0;
    local_2f8._4_4_ = 0;
    local_2f8.m_compute.m_id = 0;
    local_2f8.m_compute._4_4_ = 0;
    local_2f8.m_compute.m_context = (Context *)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2f8,0x100);
    fVar16 = 0.0;
    fVar22 = 1.4013e-45;
    fVar25 = 2.8026e-45;
    fVar28 = 4.2039e-45;
    lVar9 = 0;
    do {
      pfVar1 = (pointer)(local_2f8._0_8_ + lVar9 * 4);
      *pfVar1 = fVar16;
      pfVar1[1] = fVar22;
      pfVar1[2] = fVar25;
      pfVar1[3] = fVar28;
      lVar9 = lVar9 + 4;
      fVar16 = (float)((int)fVar16 + 4);
      fVar22 = (float)((int)fVar22 + 4);
      fVar25 = (float)((int)fVar25 + 4);
      fVar28 = (float)((int)fVar28 + 4);
    } while (lVar9 != 0x100);
    (*gl->bindTexture)(0xde1,texture_id);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    (*gl->getTexImage)(0xde1,1,0x8d94,0x1405,(void *)local_2f8._0_8_);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    uVar10 = 0;
    if (*(float *)local_2f8._0_8_ == 0.0) {
      do {
        uVar14 = uVar10;
        if (uVar14 == 0xff) goto LAB_00d8c013;
        uVar10 = uVar14 + 1;
      } while (*(float *)(local_2f8._0_8_ + (uVar14 + 1) * 4) == 0.0);
      bVar15 = 0xfe < uVar14;
    }
    else {
      bVar15 = false;
    }
    local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Invalid value: ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,". Expected value: ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," at offset: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    return true;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  pfVar12 = (float *)local_2f8._0_8_;
  if ((float *)local_2f8._0_8_ == (float *)0x0) {
    return bVar15;
  }
LAB_00d8cd2b:
  operator_delete(pfVar12,(long)local_2f8.m_compute.m_context - (long)pfVar12);
  return bVar15;
LAB_00d8c013:
  bVar15 = true;
  pfVar12 = (float *)local_2f8._0_8_;
  goto LAB_00d8cd2b;
}

Assistant:

bool ImageLoadStoreTest::verifyInvalidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();
	gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

	bool result = true;

	if (R8 == m_test_case)
	{
		static const GLuint n_channels = 1;

		std::vector<GLubyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = static_cast<GLubyte>(i);
		}

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED, GL_UNSIGNED_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLubyte expected_red = 0;
			const GLubyte drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << (GLuint)drawn_red
													<< ". Expected value: " << (GLuint)expected_red
													<< " at offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RG8_SNORM == m_test_case)
	{
		static const GLuint n_channels = 2;

		std::vector<GLbyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = static_cast<GLubyte>(i);
			pixels[i * n_channels + 1] = static_cast<GLubyte>(i);
		}

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RG, GL_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLbyte expected_red   = 0;
			const GLbyte expected_green = 0;
			const GLbyte drawn_red		= pixels[i * n_channels + 0];
			const GLbyte drawn_green	= pixels[i * n_channels + 1];

			if ((expected_red != drawn_red) || (expected_green != drawn_green))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << (GLint)drawn_red << ", " << (GLint)drawn_green
					<< ". Expected value: " << (GLint)expected_red << ", " << (GLint)expected_green
					<< ". At offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = 0.0f;
			const GLfloat expected_green = 0.0f;
			const GLfloat expected_blue  = 0.0f;
			const GLfloat expected_alpha = 0.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 1;

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = i;
		}

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		Texture::GetData(gl, 1 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = 0;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MULTISAMPLE == m_test_case)
	{
		static const GLuint n_channels = 1;

		/* Compute shader */
		static const GLchar* cs = "#version 430 core\n"
								  "\n"
								  "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
								  "\n"
								  "layout (location = 1)        writeonly uniform uimage2D   uni_destination_image;\n"
								  "layout (location = 0, r32ui) readonly  uniform uimage2DMS uni_source_image;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    const ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n"
								  "\n"
								  "    const uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n"
								  "    const uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n"
								  "    const uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n"
								  "    const uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n"
								  "\n"
								  "    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(0))))\n"
								  "    {\n"
								  "        imageStore(uni_destination_image, point, uvec4(1, 1, 1, 1));\n"
								  "    }\n"
								  "    else\n"
								  "    {\n"
								  "        imageStore(uni_destination_image, point, uvec4(0, 0, 0, 0));\n"
								  "    }\n"
								  "}\n"
								  "\n";

		Program program(m_context);
		Texture destination_texture(m_context);

		Texture::Generate(gl, destination_texture.m_id);
		Texture::Bind(gl, destination_texture.m_id, GL_TEXTURE_2D);
		Texture::Storage(gl, GL_TEXTURE_2D, 1, GL_R32UI, width, height, 0 /* depth */);

		program.Init(cs, "", "", "", "", "");
		program.Use();
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
							GL_READ_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
		gl.bindImageTexture(1 /* unit */, destination_texture.m_id, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

		gl.uniform1i(0 /* location */, 0 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.uniform1i(1 /* location */, 1 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.dispatchCompute(16, 16, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Pixels buffer initialization */
		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = i;
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = 1;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}